

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SigmoidKernel::SerializeWithCachedSizes
          (SigmoidKernel *this,CodedOutputStream *output)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  void *extraout_RDX_01;
  CodedOutputStream *pCVar2;
  double in_XMM0_Qa;
  double dVar3;
  double extraout_XMM0_Qa;
  double value;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SigmoidKernel *this_local;
  
  pCVar2 = output;
  dVar3 = gamma(this,in_XMM0_Qa);
  if ((dVar3 != 0.0) || (pvVar1 = extraout_RDX, NAN(dVar3))) {
    dVar3 = gamma(this,dVar3);
    pCVar2 = output;
    google::protobuf::internal::WireFormatLite::WriteDouble(1,dVar3,output);
    pvVar1 = extraout_RDX_00;
  }
  c(this,pCVar2,pvVar1);
  if ((extraout_XMM0_Qa != 0.0) || (NAN(extraout_XMM0_Qa))) {
    c(this,pCVar2,extraout_RDX_01);
    google::protobuf::internal::WireFormatLite::WriteDouble(2,value,output);
  }
  return;
}

Assistant:

void SigmoidKernel::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SigmoidKernel)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // double gamma = 1;
  if (this->gamma() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(1, this->gamma(), output);
  }

  // double c = 2;
  if (this->c() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(2, this->c(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SigmoidKernel)
}